

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O0

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::insertNode
          (iterator *this,uint32_t level,NodeRef node,interval<int> *key,allocator_type *alloc)

{
  uint32_t uVar1;
  IndexPair offset;
  BranchNode<int,_12U,_false> *this_00;
  uint32_t *puVar2;
  uint32_t in_ESI;
  BranchNode<int,_12U,_true> *in_RDI;
  allocator_type *in_stack_00000020;
  uint32_t in_stack_0000002c;
  iterator *in_stack_00000030;
  IndexPair newOffset;
  Path *path;
  IntervalMap<int,_int,_0U> *map;
  bool split;
  undefined4 in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff5c;
  Path *in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  uint32_t uVar3;
  Path *in_stack_ffffffffffffff70;
  interval<int> *key_00;
  undefined4 in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  NodeRef in_stack_ffffffffffffff80;
  uintptr_t uVar4;
  undefined8 in_stack_ffffffffffffff88;
  Path *in_stack_ffffffffffffff98;
  bool local_31;
  uint32_t local_1c;
  
  uVar3 = (uint32_t)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  local_31 = false;
  uVar4 = (in_RDI->
          super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
          ).first[0].pip.value;
  key_00 = (interval<int> *)
           ((in_RDI->
            super_NodeBase<slang::IntervalMapDetails::NodeRef,_slang::IntervalMapDetails::interval<int>,_12U>
            ).first + 1);
  local_1c = in_ESI;
  if (in_ESI == 1) {
    if (*(uint *)(uVar4 + 0xc4) < 0xc) {
      IntervalMapDetails::Path::offset(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      IntervalMapDetails::BranchNode<int,_12U,_true>::insert
                ((BranchNode<int,_12U,_true> *)
                 CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                 (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff80,
                 (interval<int> *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      *(int *)(uVar4 + 0xc4) = *(int *)(uVar4 + 0xc4) + 1;
      IntervalMapDetails::Path::setSize
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      IntervalMapDetails::Path::reset
                ((Path *)in_stack_ffffffffffffff80.pip.value,in_stack_ffffffffffffff7c);
      return false;
    }
    local_31 = true;
    IntervalMapDetails::Path::offset(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    offset = splitRoot((IntervalMap<int,_int,_0U> *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                       (allocator_type *)
                       CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    IntervalMapDetails::Path::replaceRoot<slang::IntervalMapDetails::BranchNode<int,12u,true>>
              (in_stack_ffffffffffffff98,in_RDI,uVar3,offset);
    local_1c = 2;
    in_stack_ffffffffffffff80.pip.value =
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)
         (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)uVar4;
  }
  IntervalMapDetails::Path::legalizeForInsert(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar1 = IntervalMapDetails::Path::size(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  uVar3 = local_1c - 1;
  if ((uVar1 == 0xc) &&
     (local_31 = IntervalMap<int,int,0u>::iterator::
                 overflow<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                           (in_stack_00000030,in_stack_0000002c,in_stack_00000020), local_31)) {
    uVar3 = local_1c;
  }
  local_1c = uVar3;
  this_00 = IntervalMapDetails::Path::node<slang::IntervalMapDetails::BranchNode<int,12u,false>>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  puVar2 = IntervalMapDetails::Path::offset((Path *)this_00,in_stack_ffffffffffffff5c);
  uVar3 = *puVar2;
  IntervalMapDetails::Path::size((Path *)this_00,in_stack_ffffffffffffff5c);
  IntervalMapDetails::BranchNode<int,_12U,_false>::insert
            ((BranchNode<int,_12U,_false> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff70,in_stack_ffffffffffffff80,
             (interval<int> *)CONCAT44(uVar3,in_stack_ffffffffffffff68));
  IntervalMapDetails::Path::size((Path *)this_00,in_stack_ffffffffffffff5c);
  IntervalMapDetails::Path::setSize((Path *)key_00,uVar3,in_stack_ffffffffffffff68);
  updateParentBounds((iterator *)in_stack_ffffffffffffff80.pip.value,local_1c,key_00);
  IntervalMapDetails::Path::reset((Path *)in_stack_ffffffffffffff80.pip.value,local_1c);
  return local_31;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::insertNode(
    uint32_t level, IntervalMapDetails::NodeRef node, const IntervalMapDetails::interval<TKey>& key,
    allocator_type& alloc) {
    SLANG_ASSERT(level > 0);

    bool split = false;
    auto& map = *this->map;
    auto& path = this->path;

    if (level == 1) {
        // Insert into the root branch node.
        if (map.rootSize < RootBranch::Capacity) {
            map.rootBranch.insert(path.offset(0), map.rootSize, node, key);
            path.setSize(0, ++map.rootSize);
            path.reset(level);
            return false;
        }

        // We need to split the root while keeping our position.
        split = true;
        auto newOffset = map.splitRoot(path.offset(0), alloc);
        path.replaceRoot(&map.rootBranch, map.rootSize, newOffset);

        // Fall through to insert at the new higher level.
        level++;
    }

    // When inserting before end, make sure we have a valid path.
    path.legalizeForInsert(--level);

    if (path.size(level) == Branch::Capacity) {
        // Branch node is full, we need to split it.
        SLANG_ASSERT(!split);
        split = overflow<Branch>(level, alloc);
        if (split)
            level++;
    }

    // Actually insert into the branch node.
    path.template node<Branch>(level).insert(path.offset(level), path.size(level), node, key);
    path.setSize(level, path.size(level) + 1);
    updateParentBounds(level, key);

    path.reset(level + 1);
    return split;
}